

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog.cpp
# Opt level: O2

void __thiscall Dialog::BuildPacket(Dialog *this,PacketBuilder *builder)

{
  _Elt_pointer pbVar1;
  int iVar2;
  _Base_ptr p_Var3;
  _Elt_pointer pbVar4;
  _Elt_pointer pbVar5;
  _Map_pointer local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> page;
  
  iVar2 = PacketLength(this);
  PacketBuilder::ReserveMore(builder,(long)iVar2);
  pbVar5 = (this->pages).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar4 = (this->pages).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_60 = (this->pages).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar1 = (this->pages).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (pbVar5 != pbVar1) {
    std::__cxx11::string::string((string *)&page,(string *)pbVar5);
    PacketBuilder::AddShort(builder,1);
    PacketBuilder::AddBreakString(builder,&page,0xff);
    std::__cxx11::string::~string((string *)&page);
    pbVar5 = pbVar5 + 1;
    if (pbVar5 == pbVar4) {
      pbVar5 = local_60[1];
      local_60 = local_60 + 1;
      pbVar4 = pbVar5 + 0x10;
    }
  }
  for (p_Var3 = (this->links)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->links)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&page,(pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(p_Var3 + 1));
    PacketBuilder::AddShort(builder,2);
    PacketBuilder::AddShort(builder,(int)page._M_dataplus._M_p);
    PacketBuilder::AddBreakString(builder,(string *)&page._M_string_length,0xff);
    std::__cxx11::string::~string((string *)&page._M_string_length);
  }
  return;
}

Assistant:

void Dialog::BuildPacket(PacketBuilder& builder) const
{
	builder.ReserveMore(this->PacketLength());

	UTIL_FOREACH(this->pages, page)
	{
		builder.AddShort(DIALOG_TEXT);
		builder.AddBreakString(page);
	}

	UTIL_FOREACH(this->links, link)
	{
		builder.AddShort(DIALOG_LINK);
		builder.AddShort(link.first);
		builder.AddBreakString(link.second);
	}
}